

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O1

int EVP_sha256_final_with_secret_suffix
              (SHA256_CTX *ctx,uint8_t *out,uint8_t *in,size_t len,size_t max_len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t j;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __n;
  size_t i;
  ulong uVar9;
  uint8_t length_bytes [4];
  uint32_t result [8];
  uint8_t block [64];
  byte abStack_110 [48];
  undefined8 uStack_e0;
  uint local_d4;
  ulong local_d0;
  uint8_t *local_c8;
  uint8_t *local_c0;
  uint8_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_98 [8];
  byte local_78 [72];
  
  iVar4 = 0;
  if (((max_len >> 0x3d == 0) && (iVar4 = 0, ctx->Nh == 0)) &&
     (uVar3 = ctx->Nl, iVar4 = 0,
     max_len * 8 + (ulong)uVar3 >> 0x20 == 0 && !CARRY8(max_len * 8,(ulong)uVar3))) {
    local_a0 = len + ctx->num + 0x48 >> 6;
    local_a8 = local_a0 - 1;
    local_b0 = ctx->num + max_len + 0x48 >> 6;
    uVar3 = uVar3 + (int)len * 8;
    local_d4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
    local_78[0x30] = 0;
    local_78[0x31] = 0;
    local_78[0x32] = 0;
    local_78[0x33] = 0;
    local_78[0x34] = 0;
    local_78[0x35] = 0;
    local_78[0x36] = 0;
    local_78[0x37] = 0;
    local_78[0x38] = 0;
    local_78[0x39] = 0;
    local_78[0x3a] = 0;
    local_78[0x3b] = 0;
    local_78[0x3c] = 0;
    local_78[0x3d] = 0;
    local_78[0x3e] = 0;
    local_78[0x3f] = 0;
    local_78[0x20] = 0;
    local_78[0x21] = 0;
    local_78[0x22] = 0;
    local_78[0x23] = 0;
    local_78[0x24] = 0;
    local_78[0x25] = 0;
    local_78[0x26] = 0;
    local_78[0x27] = 0;
    local_78[0x28] = 0;
    local_78[0x29] = 0;
    local_78[0x2a] = 0;
    local_78[0x2b] = 0;
    local_78[0x2c] = 0;
    local_78[0x2d] = 0;
    local_78[0x2e] = 0;
    local_78[0x2f] = 0;
    local_78[0x10] = 0;
    local_78[0x11] = 0;
    local_78[0x12] = 0;
    local_78[0x13] = 0;
    local_78[0x14] = 0;
    local_78[0x15] = 0;
    local_78[0x16] = 0;
    local_78[0x17] = 0;
    local_78[0x18] = 0;
    local_78[0x19] = 0;
    local_78[0x1a] = 0;
    local_78[0x1b] = 0;
    local_78[0x1c] = 0;
    local_78[0x1d] = 0;
    local_78[0x1e] = 0;
    local_78[0x1f] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[6] = 0;
    local_78[7] = 0;
    local_78[8] = 0;
    local_78[9] = 0;
    local_78[10] = 0;
    local_78[0xb] = 0;
    local_78[0xc] = 0;
    local_78[0xd] = 0;
    local_78[0xe] = 0;
    local_78[0xf] = 0;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_98[0] = 0;
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_c0 = ctx->data;
    local_a0 = -local_a0;
    uVar7 = 0;
    uVar9 = 0;
    local_d0 = len;
    local_c8 = out;
    local_b8 = in;
    do {
      if (uVar9 == 0) {
        __n = (ulong)ctx->num;
        if (__n != 0) {
          uStack_e0 = 0x18059b;
          memcpy(local_78,local_c0,__n);
        }
      }
      else {
        __n = 0;
      }
      uVar5 = max_len - uVar7;
      if (uVar7 <= max_len && uVar5 != 0) {
        uVar8 = 0x40 - __n;
        if (uVar5 <= 0x40 - __n) {
          uVar8 = uVar5;
        }
        if (uVar8 != 0) {
          uStack_e0 = 0x1805cd;
          memcpy(local_78 + __n,local_b8 + uVar7,uVar8);
        }
      }
      if ((uint)__n < 0x40) {
        uVar5 = uVar7;
        uVar8 = __n;
        do {
          bVar2 = (byte)(uVar5 >> 0x38);
          bVar1 = (byte)((local_d0 ^ uVar5) >> 0x38);
          local_78[uVar8] =
               (byte)((local_d0 ^ uVar5) - 1 >> 0x38) & ~bVar1 & 0x80 |
               (char)(((byte)(uVar5 - local_d0 >> 0x38) ^ bVar2 | bVar1) ^ bVar2) >> 7 &
               local_78[uVar8];
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar8 != 0x40);
      }
      uVar5 = (uVar9 ^ local_a8) - 1 & local_a0;
      lVar6 = 0x3c;
      do {
        local_78[lVar6] = local_78[lVar6] | abStack_110[lVar6] & (byte)((long)uVar5 >> 0x3f);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      uStack_e0 = 0x180665;
      SHA256_Transform((SHA256_CTX *)ctx,local_78);
      lVar6 = 0;
      do {
        local_98[lVar6] = local_98[lVar6] | ctx->h[lVar6] & (uint)((long)uVar5 >> 0x3f);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      uVar7 = (uVar7 + 0x40) - __n;
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_b0);
    lVar6 = 0;
    do {
      uVar3 = local_98[lVar6];
      *(uint *)(local_c8 + lVar6 * 4) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int EVP_sha256_final_with_secret_suffix(SHA256_CTX *ctx,
                                        uint8_t out[SHA256_DIGEST_LENGTH],
                                        const uint8_t *in, size_t len,
                                        size_t max_len) {
  // Bound the input length so |total_bits| below fits in four bytes. This is
  // redundant with TLS record size limits. This also ensures |input_idx| below
  // does not overflow.
  size_t max_len_bits = max_len << 3;
  if (ctx->Nh != 0 ||
      (max_len_bits >> 3) != max_len ||  // Overflow
      ctx->Nl + max_len_bits < max_len_bits ||
      ctx->Nl + max_len_bits > UINT32_MAX) {
    return 0;
  }

  // We need to hash the following into |ctx|:
  //
  // - ctx->data[:ctx->num]
  // - in[:len]
  // - A 0x80 byte
  // - However many zero bytes are needed to pad up to a block.
  // - Eight bytes of length.
  size_t num_blocks = (ctx->num + len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;
  size_t last_block = num_blocks - 1;
  size_t max_blocks = (ctx->num + max_len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;

  // The bounds above imply |total_bits| fits in four bytes.
  size_t total_bits = ctx->Nl + (len << 3);
  uint8_t length_bytes[4];
  length_bytes[0] = (uint8_t)(total_bits >> 24);
  length_bytes[1] = (uint8_t)(total_bits >> 16);
  length_bytes[2] = (uint8_t)(total_bits >> 8);
  length_bytes[3] = (uint8_t)total_bits;

  // We now construct and process each expected block in constant-time.
  uint8_t block[SHA256_CBLOCK] = {0};
  uint32_t result[8] = {0};
  // input_idx is the index into |in| corresponding to the current block.
  // However, we allow this index to overflow beyond |max_len|, to simplify the
  // 0x80 byte.
  size_t input_idx = 0;
  for (size_t i = 0; i < max_blocks; i++) {
    // Fill |block| with data from the partial block in |ctx| and |in|. We copy
    // as if we were hashing up to |max_len| and then zero the excess later.
    size_t block_start = 0;
    if (i == 0) {
      OPENSSL_memcpy(block, ctx->data, ctx->num);
      block_start = ctx->num;
    }
    if (input_idx < max_len) {
      size_t to_copy = SHA256_CBLOCK - block_start;
      if (to_copy > max_len - input_idx) {
        to_copy = max_len - input_idx;
      }
      OPENSSL_memcpy(block + block_start, in + input_idx, to_copy);
    }

    // Zero any bytes beyond |len| and add the 0x80 byte.
    for (size_t j = block_start; j < SHA256_CBLOCK; j++) {
      // input[idx] corresponds to block[j].
      size_t idx = input_idx + j - block_start;
      // The barriers on |len| are not strictly necessary. However, without
      // them, GCC compiles this code by incorporating |len| into the loop
      // counter and subtracting it out later. This is still constant-time, but
      // it frustrates attempts to validate this.
      uint8_t is_in_bounds = constant_time_lt_8(idx, value_barrier_w(len));
      uint8_t is_padding_byte = constant_time_eq_8(idx, value_barrier_w(len));
      block[j] &= is_in_bounds;
      block[j] |= 0x80 & is_padding_byte;
    }

    input_idx += SHA256_CBLOCK - block_start;

    // Fill in the length if this is the last block.
    crypto_word_t is_last_block = constant_time_eq_w(i, last_block);
    for (size_t j = 0; j < 4; j++) {
      block[SHA256_CBLOCK - 4 + j] |= is_last_block & length_bytes[j];
    }

    // Process the block and save the hash state if it is the final value.
    SHA256_Transform(ctx, block);
    for (size_t j = 0; j < 8; j++) {
      result[j] |= is_last_block & ctx->h[j];
    }
  }

  // Write the output.
  for (size_t i = 0; i < 8; i++) {
    CRYPTO_store_u32_be(out + 4 * i, result[i]);
  }
  return 1;
}